

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.c
# Opt level: O0

int mmk_verify_times(mmk_verify_params *params)

{
  ulong uVar1;
  long *in_FS_OFFSET;
  bool local_31;
  ulong local_30;
  size_t most;
  size_t t;
  mmk_verify_params *params_local;
  
  uVar1 = *(ulong *)(*in_FS_OFFSET + -0x10);
  if (params->never == 0) {
    if ((params->at_least == 0) && (params->at_most == 0)) {
      if (params->matching == (_func_int_size_t *)0x0) {
        if (params->times == 0) {
          params_local._4_4_ = 1;
        }
        else {
          params_local._4_4_ = (uint)(params->times == uVar1);
        }
      }
      else {
        params_local._4_4_ = (*params->matching)(uVar1);
      }
    }
    else {
      local_30 = uVar1;
      if (params->at_most != 0) {
        local_30 = params->at_most;
      }
      local_31 = params->at_least <= uVar1 && uVar1 <= local_30;
      params_local._4_4_ = (uint)local_31;
    }
  }
  else {
    params_local._4_4_ = (uint)(uVar1 == 0);
  }
  return params_local._4_4_;
}

Assistant:

int mmk_verify_times(struct mmk_verify_params *params)
{
    size_t t = tls_get(size_t, times);
    if (params->never)
        return t == 0;
    if (params->at_least || params->at_most) {
        size_t most = params->at_most ? params->at_most : t;
        return t >= params->at_least && t <= most;
    }
    if (params->matching)
        return params->matching(t);
    if (params->times > 0)
        return params->times == t;
    return 1;
}